

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O3

Matrix * __thiscall CSR::turnToRegular(CSR *this)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  Matrix *this_00;
  int iVar7;
  long lVar8;
  long lVar9;
  string local_48;
  
  this_00 = (Matrix *)operator_new(0x30);
  iVar1 = this->row;
  iVar7 = this->col;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"turn to regular:","");
  Matrix::Matrix(this_00,iVar1,iVar7,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar1 = this->row;
  if (0 < (long)iVar1) {
    pdVar3 = this->val;
    piVar4 = this->ptr;
    piVar5 = this->idx;
    lVar8 = 0;
    iVar7 = *piVar4;
    do {
      iVar2 = piVar4[lVar8 + 1];
      if (iVar7 < iVar2) {
        pdVar6 = this_00->array[lVar8];
        lVar9 = (long)iVar7;
        do {
          pdVar6[piVar5[lVar9]] = pdVar3[lVar9];
          lVar9 = lVar9 + 1;
        } while (iVar2 != lVar9);
      }
      lVar8 = lVar8 + 1;
      iVar7 = iVar2;
    } while (lVar8 != iVar1);
  }
  return this_00;
}

Assistant:

Matrix* CSR::turnToRegular()
{

    Matrix *y = new Matrix(row, col, "turn to regular:");

    for (int i = 0; i < row; i++)
    {
        for (int j = ptr[i]; j < ptr[i + 1]; j++)
        {

            y->array[i][idx[j]] = val[j];

        }
    }
    return y;
}